

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMap.c
# Opt level: O3

Mpm_Cut_t * Mpm_ManMergeCuts(Mpm_Man_t *p,Mpm_Cut_t *pCut0,Mpm_Cut_t *pCut1,Mpm_Cut_t *pCut2)

{
  void *__dest;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  void *pvVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  Mpm_Cut_t *pMVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  
  lVar5 = (long)(p->vFreeUnits).nSize;
  if (lVar5 < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x1b7,"void *Vec_PtrEntryLast(Vec_Ptr_t *)");
  }
  pvVar4 = (p->vFreeUnits).pArray[lVar5 + -1];
  __dest = (void *)((long)pvVar4 + 0x24);
  memcpy(__dest,pCut0->pLeaves,(ulong)(*(uint *)&pCut0->field_0x4 >> 0x19 & 0xfffffffc));
  uVar6 = *(uint *)((long)pvVar4 + 0x20) & 0x7ffffff | *(uint *)&pCut0->field_0x4 & 0xf8000000;
  *(uint *)((long)pvVar4 + 0x20) = uVar6;
  if (p->pPars->fUseDsd == 0) {
    iVar8 = 1;
    uVar9 = uVar6;
    do {
      pMVar12 = pCut2;
      if (iVar8 == 1) {
        pMVar12 = pCut1;
      }
      if (pMVar12 == (Mpm_Cut_t *)0x0) break;
      uVar10 = *(uint *)&pMVar12->field_0x4;
      if (0x7ffffff < uVar10) {
        uVar13 = 0;
        do {
          uVar16 = pMVar12->pLeaves[uVar13];
          if ((int)uVar16 < 0) goto LAB_0047e39b;
          uVar11 = 0;
          if (0x7ffffff < uVar9) {
            uVar11 = 0;
            do {
              uVar7 = *(uint *)((long)__dest + uVar11 * 4);
              if ((int)uVar7 < 0) goto LAB_0047e39b;
              if ((uVar7 ^ uVar16) < 2) goto LAB_0047e253;
              uVar11 = uVar11 + 1;
            } while (uVar9 >> 0x1b != uVar11);
            uVar11 = (ulong)(uVar9 >> 0x1b);
          }
LAB_0047e253:
          if ((uint)uVar11 == uVar6 >> 0x1b) {
            if ((uint)uVar11 == p->nLutSize) {
              return (Mpm_Cut_t *)0x0;
            }
            uVar6 = uVar6 + 0x8000000;
            *(uint *)((long)pvVar4 + 0x20) = uVar6;
            *(uint *)((long)pvVar4 + (uVar11 & 0xffffffff) * 4 + 0x24) = uVar16;
            uVar10 = *(uint *)&pMVar12->field_0x4;
          }
          uVar13 = uVar13 + 1;
          uVar9 = uVar6;
        } while (uVar13 < uVar10 >> 0x1b);
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 != 3);
  }
  else {
    lVar5 = 1;
    do {
      pMVar12 = pCut2;
      if (lVar5 == 1) {
        pMVar12 = pCut1;
      }
      if (pMVar12 == (Mpm_Cut_t *)0x0) break;
      p->uPermMask[lVar5] = 0x3ffff;
      p->uComplMask[lVar5] = 0;
      if (0x7ffffff < *(uint *)&pMVar12->field_0x4) {
        uVar6 = 0x3ffff;
        uVar13 = 0;
        do {
          uVar9 = pMVar12->pLeaves[uVar13];
          if ((int)uVar9 < 0) {
LAB_0047e39b:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          uVar10 = *(uint *)((long)pvVar4 + 0x20);
          uVar16 = uVar10 >> 0x1b;
          uVar11 = 0;
          if (uVar10 < 0x8000000) {
LAB_0047e12a:
            uVar7 = (uint)uVar11;
            if (uVar7 == uVar16) goto LAB_0047e154;
          }
          else {
            uVar11 = 0;
            do {
              uVar7 = *(uint *)((long)__dest + uVar11 * 4);
              if ((int)uVar7 < 0) goto LAB_0047e39b;
              if ((uVar7 ^ uVar9) < 2) goto LAB_0047e12a;
              uVar11 = uVar11 + 1;
              uVar7 = uVar16;
            } while (uVar16 != uVar11);
LAB_0047e154:
            if (uVar16 == p->nLutSize) {
              return (Mpm_Cut_t *)0x0;
            }
            *(uint *)((long)pvVar4 + 0x20) = uVar10 + 0x8000000;
            *(uint *)((long)pvVar4 + (ulong)uVar16 * 4 + 0x24) = uVar9;
            uVar6 = p->uPermMask[lVar5];
          }
          uVar6 = (~(uint)uVar13 & 7) << ((byte)uVar7 * '\x03' & 0x1f) ^ uVar6;
          p->uPermMask[lVar5] = uVar6;
          if (pMVar12->pLeaves[uVar13] != *(int *)((long)__dest + (long)(int)uVar7 * 4)) {
            p->uComplMask[lVar5] = p->uComplMask[lVar5] | 1 << ((byte)uVar7 & 0x1f);
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 < *(uint *)&pMVar12->field_0x4 >> 0x1b);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
  }
  ((Mpm_Cut_t *)((long)pvVar4 + 0x1c))->hNext = 0;
  if (pCut1 == (Mpm_Cut_t *)0x0) {
    uVar9 = *(uint *)&pCut0->field_0x4 & 0x1ffffff;
    uVar6 = *(uint *)((long)pvVar4 + 0x20);
    *(uint *)((long)pvVar4 + 0x20) = uVar6 & 0xfe000000 | uVar9;
    uVar10 = *(uint *)&pCut0->field_0x4 & 0x4000000;
    *(uint *)((long)pvVar4 + 0x20) = uVar6 & 0xfa000000 | uVar9 | uVar10;
    uVar6 = uVar6 & 0xf8000000 | uVar9 | uVar10 | *(uint *)&pCut0->field_0x4 & 0x2000000;
  }
  else {
    uVar6 = *(uint *)((long)pvVar4 + 0x20) & 0xf8000000 | 0x1ffffff;
  }
  *(uint *)((long)pvVar4 + 0x20) = uVar6;
  uVar1 = p->nCutsMerged;
  uVar2 = p->nCutsMergedAll;
  p->nCutsMerged = uVar1 + 1;
  p->nCutsMergedAll = uVar2 + 1;
  if ((p->pPars->fUseTruth != 0) && (0xfffffff < *(uint *)((long)pvVar4 + 0x20))) {
    uVar6 = *(uint *)((long)pvVar4 + 0x20) >> 0x1b;
    uVar11 = (ulong)uVar6;
    lVar5 = (long)pvVar4 + 0x28;
    iVar8 = 1;
    uVar13 = 0;
    do {
      uVar11 = uVar11 - 1;
      uVar14 = 0;
      uVar15 = uVar13 & 0xffffffff;
      do {
        if (*(int *)(lVar5 + uVar14 * 4) < *(int *)((long)__dest + (long)(int)uVar15 * 4)) {
          uVar15 = (ulong)(uint)(iVar8 + (int)uVar14);
        }
        uVar14 = uVar14 + 1;
      } while (uVar11 != uVar14);
      uVar3 = *(undefined4 *)((long)__dest + uVar13 * 4);
      *(undefined4 *)((long)__dest + uVar13 * 4) =
           *(undefined4 *)((long)__dest + (long)(int)uVar15 * 4);
      uVar13 = uVar13 + 1;
      *(undefined4 *)((long)__dest + (long)(int)uVar15 * 4) = uVar3;
      iVar8 = iVar8 + 1;
      lVar5 = lVar5 + 4;
    } while (uVar13 != uVar6 - 1);
  }
  return (Mpm_Cut_t *)((long)pvVar4 + 0x1c);
}

Assistant:

static inline Mpm_Cut_t * Mpm_ManMergeCuts( Mpm_Man_t * p, Mpm_Cut_t * pCut0, Mpm_Cut_t * pCut1, Mpm_Cut_t * pCut2 )
{
    Mpm_Cut_t * pTemp, * pCut = &((Mpm_Uni_t *)Vec_PtrEntryLast(&p->vFreeUnits))->pCut;
    int i, c, iPlace;
    // base cut
    memcpy( pCut->pLeaves, pCut0->pLeaves, sizeof(int) * pCut0->nLeaves );
    pCut->nLeaves = pCut0->nLeaves;
    // remaining cuts
    if ( p->pPars->fUseDsd )
    {
        for ( c = 1; c < 3; c++ )
        {
            pTemp = (c == 1) ? pCut1 : pCut2;
            if ( pTemp == NULL )
                break;
            p->uPermMask[c] = 0x3FFFF; // 18 bits
            p->uComplMask[c] = 0;     
            for ( i = 0; i < (int)pTemp->nLeaves; i++ )
            {
                iPlace = Mpm_CutFindLeaf( pCut, Abc_Lit2Var(pTemp->pLeaves[i]) );
                if ( iPlace == (int)pCut->nLeaves )
                {
                    if ( (int)pCut->nLeaves == p->nLutSize )
                        return NULL;
                    pCut->pLeaves[pCut->nLeaves++] = pTemp->pLeaves[i];
                }
                p->uPermMask[c] ^= (((i & 7) ^ 7) << (3*iPlace));
                if ( pTemp->pLeaves[i] != pCut->pLeaves[iPlace] )
                    p->uComplMask[c] |= (1 << iPlace);
            }
        }
    }
    else
    {
        for ( c = 1; c < 3; c++ )
        {
            pTemp = (c == 1) ? pCut1 : pCut2;
            if ( pTemp == NULL )
                break;
            for ( i = 0; i < (int)pTemp->nLeaves; i++ )
            {
                iPlace = Mpm_CutFindLeaf( pCut, Abc_Lit2Var(pTemp->pLeaves[i]) );
                if ( iPlace == (int)pCut->nLeaves )
                {
                    if ( (int)pCut->nLeaves == p->nLutSize )
                        return NULL;
                    pCut->pLeaves[pCut->nLeaves++] = pTemp->pLeaves[i];
                }
            }
        }
    }
    if ( pCut1 == NULL )
    {
        pCut->hNext    = 0;
        pCut->iFunc    = pCut0->iFunc;
        pCut->fUseless = pCut0->fUseless;
        pCut->fCompl   = pCut0->fCompl;
    }
    else
    {
        pCut->hNext    = 0;
        pCut->iFunc    = 0;  pCut->iFunc = ~pCut->iFunc;
        pCut->fUseless = 0;
        pCut->fCompl   = 0;
    }
    p->nCutsMerged++;
    p->nCutsMergedAll++;
    if ( p->pPars->fUseTruth )
        Vec_IntSelectSort( pCut->pLeaves, pCut->nLeaves );
    return pCut;
}